

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xdg.c
# Opt level: O3

char * xdg_get_path(char *xdg_env,char *default_path)

{
  __uid_t __uid;
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  char *pcVar4;
  passwd *ppVar5;
  void *__dest;
  
  if (((xdg_env == (char *)0x0) || (default_path == (char *)0x0)) || (*default_path == '/')) {
    __assert_fail("xdg_env && default_path && default_path[0] != \'/\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/xdg/xdg.c",
                  0x35,"char *xdg_get_path(const char *, const char *)");
  }
  pcVar2 = getenv(xdg_env);
  if ((pcVar2 == (char *)0x0) || (*pcVar2 != '/')) {
    pcVar2 = getenv("HOME");
    if ((pcVar2 == (char *)0x0) || (*pcVar2 != '/')) {
      __uid = getuid();
      ppVar5 = getpwuid(__uid);
      if (ppVar5 == (passwd *)0x0) {
        return (char *)0x0;
      }
      pcVar2 = ppVar5->pw_dir;
      if (pcVar2 == (char *)0x0) {
        return (char *)0x0;
      }
      if (*pcVar2 != '/') {
        return (char *)0x0;
      }
    }
    sVar3 = strlen(pcVar2);
    if ((sVar3 + 1 != 0) && (__dest = calloc(1,sVar3 + 1), __dest != (void *)0x0)) {
      memcpy(__dest,pcVar2,sVar3);
      iVar1 = snprintf((char *)0x0,0,"%s/%s",__dest,default_path);
      pcVar4 = (char *)calloc(1,(long)(iVar1 + 1));
      pcVar2 = (char *)0x0;
      if (pcVar4 != (char *)0x0) {
        snprintf(pcVar4,(long)(iVar1 + 1),"%s/%s",__dest,default_path);
        pcVar2 = pcVar4;
      }
      free(__dest);
      return pcVar2;
    }
  }
  else {
    sVar3 = strlen(pcVar2);
    if ((sVar3 + 1 != 0) && (pcVar4 = (char *)calloc(1,sVar3 + 1), pcVar4 != (char *)0x0)) {
      memcpy(pcVar4,pcVar2,sVar3);
      sVar3 = strlen(pcVar4);
      if (sVar3 != 0) {
        pcVar2 = pcVar4 + sVar3;
        while( true ) {
          pcVar2 = pcVar2 + -1;
          if (pcVar2 < pcVar4) {
            return pcVar4;
          }
          if (*pcVar2 != '/') break;
          *pcVar2 = '\0';
        }
        return pcVar4;
      }
    }
  }
  return (char *)0x0;
}

Assistant:

char*
xdg_get_path(const char *xdg_env, const char *default_path)
{
   assert(xdg_env && default_path && default_path[0] != '/');

   if (!xdg_env || !default_path || default_path[0] == '/')
      return NULL;

   const char *xdg_dir;
   if ((xdg_dir = getenv(xdg_env)) && xdg_dir[0] == '/')
      return strip_slash(ccopy(xdg_dir));

   char *home;
   if (!(home = get_home()))
      return NULL; /** fatal! */

   const size_t len = snprintf(NULL, 0, "%s/%s", home, default_path) + 1;

   char *path;
   if (!(path = calloc(1, len))) {
      free(home);
      return NULL; /** fatal! */
   }

   snprintf(path, len, "%s/%s", home, default_path);
   free(home);
   return path;
}